

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_test.cc
# Opt level: O0

void __thiscall
bssl::anon_unknown_0::QUICMethodTest_ZeroRTTRejectMismatchedParameters_Test::TestBody
          (QUICMethodTest_ZeroRTTRejectMismatchedParameters_Test *this)

{
  bool bVar1;
  int iVar2;
  pointer psVar3;
  char *pcVar4;
  pointer psVar5;
  SSL *pSVar6;
  SSL_SESSION *session_00;
  pointer pMVar7;
  MockQUICTransport *pMVar8;
  unsigned_long uVar9;
  char *in_R9;
  string local_680;
  AssertHelper local_660;
  Message local_658;
  bool local_649;
  undefined1 local_648 [8];
  AssertionResult gtest_ar__17;
  AssertHelper local_618;
  Message local_610;
  bool local_601;
  undefined1 local_600 [8];
  AssertionResult gtest_ar__16;
  AssertHelper local_5d0;
  Message local_5c8;
  bool local_5b9;
  undefined1 local_5b8 [8];
  AssertionResult gtest_ar__15;
  AssertHelper local_588;
  Message local_580;
  bool local_571;
  undefined1 local_570 [8];
  AssertionResult gtest_ar__14;
  AssertHelper local_540;
  Message local_538;
  int local_52c;
  undefined1 local_528 [8];
  AssertionResult gtest_ar__13;
  AssertHelper local_4f8;
  Message local_4f0;
  int local_4e4;
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar__12;
  AssertHelper local_4b0;
  Message local_4a8;
  bool local_499;
  undefined1 local_498 [8];
  AssertionResult gtest_ar__11;
  Message local_480;
  int local_478 [2];
  undefined1 local_470 [8];
  AssertionResult gtest_ar_6;
  Message local_458;
  int local_450 [2];
  undefined1 local_448 [8];
  AssertionResult gtest_ar_5;
  Message local_430;
  int local_424;
  undefined1 local_420 [8];
  AssertionResult gtest_ar_4;
  int err;
  Message local_400;
  int local_3f8 [2];
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar_3;
  AssertHelper local_3c0;
  Message local_3b8;
  bool local_3a9;
  undefined1 local_3a8 [8];
  AssertionResult gtest_ar__10;
  AssertHelper local_378;
  Message local_370;
  bool local_361;
  undefined1 local_360 [8];
  AssertionResult gtest_ar__9;
  AssertHelper local_330;
  Message local_328;
  bool local_319;
  undefined1 local_318 [8];
  AssertionResult gtest_ar__8;
  Message local_300;
  int local_2f8 [2];
  undefined1 local_2f0 [8];
  AssertionResult gtest_ar_2;
  Message local_2d8;
  int local_2d0;
  int local_2cc;
  undefined1 local_2c8 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_298;
  Message local_290;
  bool local_281;
  undefined1 local_280 [8];
  AssertionResult gtest_ar__7;
  AssertHelper local_250;
  Message local_248;
  bool local_239;
  undefined1 local_238 [8];
  AssertionResult gtest_ar__6;
  AssertHelper local_208;
  Message local_200;
  int local_1f4;
  undefined1 local_1f0 [8];
  AssertionResult gtest_ar__5;
  Message local_1d8;
  int local_1d0;
  int local_1cc;
  undefined1 local_1c8 [8];
  AssertionResult gtest_ar;
  AssertHelper local_198;
  Message local_190;
  int local_184;
  undefined1 local_180 [8];
  AssertionResult gtest_ar__4;
  AssertHelper local_150;
  Message local_148;
  bool local_139;
  undefined1 local_138 [8];
  AssertionResult gtest_ar__3;
  AssertHelper local_108;
  Message local_100;
  undefined1 local_f8 [8];
  AssertionResult gtest_ar__2;
  UniquePtr<SSL_SESSION> session;
  AssertHelper local_c0;
  Message local_b8;
  int local_ac;
  undefined1 local_a8 [8];
  AssertionResult gtest_ar__1;
  string local_90;
  AssertHelper local_70 [3];
  Message local_58;
  int local_4c;
  undefined1 local_48 [8];
  AssertionResult gtest_ar_;
  SSL_QUIC_METHOD quic_method;
  QUICMethodTest_ZeroRTTRejectMismatchedParameters_Test *this_local;
  
  QUICMethodTest::DefaultQUICMethod
            ((SSL_QUIC_METHOD *)&gtest_ar_.message_,&this->super_QUICMethodTest);
  psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                     (&(this->super_QUICMethodTest).client_ctx_);
  SSL_CTX_set_session_cache_mode(psVar3,3);
  psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                     (&(this->super_QUICMethodTest).client_ctx_);
  SSL_CTX_set_early_data_enabled(psVar3,1);
  psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                     (&(this->super_QUICMethodTest).server_ctx_);
  SSL_CTX_set_early_data_enabled(psVar3,1);
  psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                     (&(this->super_QUICMethodTest).client_ctx_);
  local_4c = SSL_CTX_set_quic_method(psVar3,(SSL_QUIC_METHOD *)&gtest_ar_.message_);
  testing::AssertionResult::AssertionResult<int>((AssertionResult *)local_48,&local_4c,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_48);
  if (!bVar1) {
    testing::Message::Message(&local_58);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_90,(internal *)local_48,
               (AssertionResult *)"SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method)","false"
               ,"true",in_R9);
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_70,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
               ,0x1d73,pcVar4);
    testing::internal::AssertHelper::operator=(local_70,&local_58);
    testing::internal::AssertHelper::~AssertHelper(local_70);
    std::__cxx11::string::~string((string *)&local_90);
    testing::Message::~Message(&local_58);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_48);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    psVar3 = std::unique_ptr<ssl_ctx_st,_bssl::internal::Deleter>::get
                       (&(this->super_QUICMethodTest).server_ctx_);
    local_ac = SSL_CTX_set_quic_method(psVar3,(SSL_QUIC_METHOD *)&gtest_ar_.message_);
    testing::AssertionResult::AssertionResult<int>
              ((AssertionResult *)local_a8,&local_ac,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a8);
    if (!bVar1) {
      testing::Message::Message(&local_b8);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&session,(internal *)local_a8,
                 (AssertionResult *)"SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method)",
                 "false","true",in_R9);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_c0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                 ,0x1d74,pcVar4);
      testing::internal::AssertHelper::operator=(&local_c0,&local_b8);
      testing::internal::AssertHelper::~AssertHelper(&local_c0);
      std::__cxx11::string::~string((string *)&session);
      testing::Message::~Message(&local_b8);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_a8);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      QUICMethodTest::CreateClientSessionForQUIC((QUICMethodTest *)&gtest_ar__2.message_);
      testing::AssertionResult::
      AssertionResult<std::unique_ptr<ssl_session_st,bssl::internal::Deleter>>
                ((AssertionResult *)local_f8,
                 (unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_,
                 (type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
      if (!bVar1) {
        testing::Message::Message(&local_100);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)&gtest_ar__3.message_,(internal *)local_f8,(AssertionResult *)0x4f1864,
                   "false","true",in_R9);
        pcVar4 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_108,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                   ,0x1d78,pcVar4);
        testing::internal::AssertHelper::operator=(&local_108,&local_100);
        testing::internal::AssertHelper::~AssertHelper(&local_108);
        std::__cxx11::string::~string((string *)&gtest_ar__3.message_);
        testing::Message::~Message(&local_100);
      }
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._5_3_ = 0;
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
      if (gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_4_ == 0) {
        local_139 = QUICMethodTest::CreateClientAndServer(&this->super_QUICMethodTest);
        testing::AssertionResult::AssertionResult<bool>
                  ((AssertionResult *)local_138,&local_139,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
        if (!bVar1) {
          testing::Message::Message(&local_148);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)&gtest_ar__4.message_,(internal *)local_138,
                     (AssertionResult *)"CreateClientAndServer()","false","true",in_R9);
          pcVar4 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_150,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                     ,0x1d7a,pcVar4);
          testing::internal::AssertHelper::operator=(&local_150,&local_148);
          testing::internal::AssertHelper::~AssertHelper(&local_150);
          std::__cxx11::string::~string((string *)&gtest_ar__4.message_);
          testing::Message::~Message(&local_148);
        }
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._5_3_ = 0;
        gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
        if (gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_4_ == 0) {
          psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                             (&(this->super_QUICMethodTest).server_);
          local_184 = SSL_set_quic_early_data_context(psVar5,"\x04",1);
          testing::AssertionResult::AssertionResult<int>
                    ((AssertionResult *)local_180,&local_184,(type *)0x0);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
          if (!bVar1) {
            testing::Message::Message(&local_190);
            testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                      ((string *)&gtest_ar.message_,(internal *)local_180,
                       (AssertionResult *)
                       "SSL_set_quic_early_data_context(server_.get(), new_context, sizeof(new_context))"
                       ,"false","true",in_R9);
            pcVar4 = (char *)std::__cxx11::string::c_str();
            testing::internal::AssertHelper::AssertHelper
                      (&local_198,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                       ,0x1d7d,pcVar4);
            testing::internal::AssertHelper::operator=(&local_198,&local_190);
            testing::internal::AssertHelper::~AssertHelper(&local_198);
            std::__cxx11::string::~string((string *)&gtest_ar.message_);
            testing::Message::~Message(&local_190);
          }
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._5_3_ = 0;
          gtest_ar__1.message_._M_t.
          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_t.
          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          .
          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
          ._M_head_impl._4_1_ = !bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
          if (gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_4_ == 0) {
            pSVar6 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                      (&(this->super_QUICMethodTest).client_);
            session_00 = (SSL_SESSION *)
                         std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::get
                                   ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)
                                    &gtest_ar__2.message_);
            SSL_set_session(pSVar6,session_00);
            pSVar6 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                      (&(this->super_QUICMethodTest).client_);
            local_1cc = SSL_do_handshake(pSVar6);
            local_1d0 = 1;
            testing::internal::EqHelper::Compare<int,_int,_nullptr>
                      ((EqHelper *)local_1c8,"SSL_do_handshake(client_.get())","1",&local_1cc,
                       &local_1d0);
            bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c8);
            if (!bVar1) {
              testing::Message::Message(&local_1d8);
              pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_1c8);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&gtest_ar__5.message_,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                         ,0x1d82,pcVar4);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&gtest_ar__5.message_,&local_1d8);
              testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__5.message_);
              testing::Message::~Message(&local_1d8);
            }
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._5_3_ = 0;
            gtest_ar__1.message_._M_t.
            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl._4_1_ = !bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c8);
            if (gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_4_ == 0) {
              psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                 (&(this->super_QUICMethodTest).client_);
              local_1f4 = SSL_in_early_data(psVar5);
              testing::AssertionResult::AssertionResult<int>
                        ((AssertionResult *)local_1f0,&local_1f4,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1f0);
              if (!bVar1) {
                testing::Message::Message(&local_200);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__6.message_,(internal *)local_1f0,
                           (AssertionResult *)"SSL_in_early_data(client_.get())","false","true",
                           in_R9);
                pcVar4 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_208,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x1d83,pcVar4);
                testing::internal::AssertHelper::operator=(&local_208,&local_200);
                testing::internal::AssertHelper::~AssertHelper(&local_208);
                std::__cxx11::string::~string((string *)&gtest_ar__6.message_);
                testing::Message::~Message(&local_200);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_1f0);
              pMVar7 = std::
                       unique_ptr<bssl::(anonymous_namespace)::MockQUICTransportPair,_std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>_>
                       ::operator->(&(this->super_QUICMethodTest).transport_);
              pMVar8 = MockQUICTransportPair::client(pMVar7);
              local_239 = MockQUICTransport::HasWriteSecret(pMVar8,ssl_encryption_early_data);
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_238,&local_239,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
              if (!bVar1) {
                testing::Message::Message(&local_248);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar__7.message_,(internal *)local_238,
                           (AssertionResult *)
                           "transport_->client()->HasWriteSecret(ssl_encryption_early_data)","false"
                           ,"true",in_R9);
                pcVar4 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_250,kNonFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x1d85,pcVar4);
                testing::internal::AssertHelper::operator=(&local_250,&local_248);
                testing::internal::AssertHelper::~AssertHelper(&local_250);
                std::__cxx11::string::~string((string *)&gtest_ar__7.message_);
                testing::Message::~Message(&local_248);
              }
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
              psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                 (&(this->super_QUICMethodTest).server_);
              uVar9 = std::numeric_limits<unsigned_long>::max();
              local_281 = QUICMethodTest::ProvideHandshakeData(psVar5,uVar9);
              testing::AssertionResult::AssertionResult<bool>
                        ((AssertionResult *)local_280,&local_281,(type *)0x0);
              bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_280);
              if (!bVar1) {
                testing::Message::Message(&local_290);
                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                          ((string *)&gtest_ar_1.message_,(internal *)local_280,
                           (AssertionResult *)"ProvideHandshakeData(server_.get())","false","true",
                           in_R9);
                pcVar4 = (char *)std::__cxx11::string::c_str();
                testing::internal::AssertHelper::AssertHelper
                          (&local_298,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                           ,0x1d88,pcVar4);
                testing::internal::AssertHelper::operator=(&local_298,&local_290);
                testing::internal::AssertHelper::~AssertHelper(&local_298);
                std::__cxx11::string::~string((string *)&gtest_ar_1.message_);
                testing::Message::~Message(&local_290);
              }
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._5_3_ = 0;
              gtest_ar__1.message_._M_t.
              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              .
              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
              ._M_head_impl._4_1_ = !bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)local_280);
              if (gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_4_ == 0) {
                pSVar6 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                          (&(this->super_QUICMethodTest).server_);
                local_2cc = SSL_do_handshake(pSVar6);
                local_2d0 = -1;
                testing::internal::EqHelper::Compare<int,_int,_nullptr>
                          ((EqHelper *)local_2c8,"SSL_do_handshake(server_.get())","-1",&local_2cc,
                           &local_2d0);
                bVar1 = testing::AssertionResult::operator_cast_to_bool
                                  ((AssertionResult *)local_2c8);
                if (!bVar1) {
                  testing::Message::Message(&local_2d8);
                  pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2c8);
                  testing::internal::AssertHelper::AssertHelper
                            ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                             ,0x1d89,pcVar4);
                  testing::internal::AssertHelper::operator=
                            ((AssertHelper *)&gtest_ar_2.message_,&local_2d8);
                  testing::internal::AssertHelper::~AssertHelper
                            ((AssertHelper *)&gtest_ar_2.message_);
                  testing::Message::~Message(&local_2d8);
                }
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._5_3_ = 0;
                gtest_ar__1.message_._M_t.
                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl._4_1_ = !bVar1;
                testing::AssertionResult::~AssertionResult((AssertionResult *)local_2c8);
                if (gtest_ar__1.message_._M_t.
                    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    .
                    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                    ._M_head_impl._4_4_ == 0) {
                  local_2f8[1] = 2;
                  pSVar6 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                            (&(this->super_QUICMethodTest).server_);
                  local_2f8[0] = SSL_get_error(pSVar6,-1);
                  testing::internal::EqHelper::Compare<int,_int,_nullptr>
                            ((EqHelper *)local_2f0,"2","SSL_get_error(server_.get(), -1)",
                             local_2f8 + 1,local_2f8);
                  bVar1 = testing::AssertionResult::operator_cast_to_bool
                                    ((AssertionResult *)local_2f0);
                  if (!bVar1) {
                    testing::Message::Message(&local_300);
                    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_2f0)
                    ;
                    testing::internal::AssertHelper::AssertHelper
                              ((AssertHelper *)&gtest_ar__8.message_,kFatalFailure,
                               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                               ,0x1d8a,pcVar4);
                    testing::internal::AssertHelper::operator=
                              ((AssertHelper *)&gtest_ar__8.message_,&local_300);
                    testing::internal::AssertHelper::~AssertHelper
                              ((AssertHelper *)&gtest_ar__8.message_);
                    testing::Message::~Message(&local_300);
                  }
                  gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._5_3_ = 0;
                  gtest_ar__1.message_._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  .
                  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                  ._M_head_impl._4_1_ = !bVar1;
                  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2f0);
                  if (gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_ == 0) {
                    psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                       (&(this->super_QUICMethodTest).server_);
                    iVar2 = SSL_in_early_data(psVar5);
                    local_319 = iVar2 == 0;
                    testing::AssertionResult::AssertionResult<bool>
                              ((AssertionResult *)local_318,&local_319,(type *)0x0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_318);
                    if (!bVar1) {
                      testing::Message::Message(&local_328);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&gtest_ar__9.message_,(internal *)local_318,
                                 (AssertionResult *)"SSL_in_early_data(server_.get())","true",
                                 "false",in_R9);
                      pcVar4 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_330,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                 ,0x1d8b,pcVar4);
                      testing::internal::AssertHelper::operator=(&local_330,&local_328);
                      testing::internal::AssertHelper::~AssertHelper(&local_330);
                      std::__cxx11::string::~string((string *)&gtest_ar__9.message_);
                      testing::Message::~Message(&local_328);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
                    pMVar7 = std::
                             unique_ptr<bssl::(anonymous_namespace)::MockQUICTransportPair,_std::default_delete<bssl::(anonymous_namespace)::MockQUICTransportPair>_>
                             ::operator->(&(this->super_QUICMethodTest).transport_);
                    pMVar8 = MockQUICTransportPair::server(pMVar7);
                    local_361 = MockQUICTransport::HasReadSecret(pMVar8,ssl_encryption_early_data);
                    local_361 = !local_361;
                    testing::AssertionResult::AssertionResult<bool>
                              ((AssertionResult *)local_360,&local_361,(type *)0x0);
                    bVar1 = testing::AssertionResult::operator_cast_to_bool
                                      ((AssertionResult *)local_360);
                    if (!bVar1) {
                      testing::Message::Message(&local_370);
                      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                ((string *)&gtest_ar__10.message_,(internal *)local_360,
                                 (AssertionResult *)
                                 "transport_->server()->HasReadSecret(ssl_encryption_early_data)",
                                 "true","false",in_R9);
                      pcVar4 = (char *)std::__cxx11::string::c_str();
                      testing::internal::AssertHelper::AssertHelper
                                (&local_378,kNonFatalFailure,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                 ,0x1d8c,pcVar4);
                      testing::internal::AssertHelper::operator=(&local_378,&local_370);
                      testing::internal::AssertHelper::~AssertHelper(&local_378);
                      std::__cxx11::string::~string((string *)&gtest_ar__10.message_);
                      testing::Message::~Message(&local_370);
                    }
                    testing::AssertionResult::~AssertionResult((AssertionResult *)local_360);
                    do {
                      psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                         (&(this->super_QUICMethodTest).client_);
                      uVar9 = std::numeric_limits<unsigned_long>::max();
                      local_3a9 = QUICMethodTest::ProvideHandshakeData(psVar5,uVar9);
                      testing::AssertionResult::AssertionResult<bool>
                                ((AssertionResult *)local_3a8,&local_3a9,(type *)0x0);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_3a8);
                      if (!bVar1) {
                        testing::Message::Message(&local_3b8);
                        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                  ((string *)&gtest_ar_3.message_,(internal *)local_3a8,
                                   (AssertionResult *)"ProvideHandshakeData(client_.get())","false",
                                   "true",in_R9);
                        pcVar4 = (char *)std::__cxx11::string::c_str();
                        testing::internal::AssertHelper::AssertHelper
                                  (&local_3c0,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                   ,0x1d90,pcVar4);
                        testing::internal::AssertHelper::operator=(&local_3c0,&local_3b8);
                        testing::internal::AssertHelper::~AssertHelper(&local_3c0);
                        std::__cxx11::string::~string((string *)&gtest_ar_3.message_);
                        testing::Message::~Message(&local_3b8);
                      }
                      gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._5_3_ = 0;
                      gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_1_ = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3a8);
                      if (gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_4_ != 0) break;
                      local_3f8[1] = 0xffffffff;
                      pSVar6 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                (&(this->super_QUICMethodTest).client_);
                      local_3f8[0] = SSL_do_handshake(pSVar6);
                      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                ((EqHelper *)local_3f0,"-1","SSL_do_handshake(client_.get())",
                                 local_3f8 + 1,local_3f8);
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_3f0);
                      if (!bVar1) {
                        testing::Message::Message(&local_400);
                        pcVar4 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_3f0);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&stack0xfffffffffffffbf8,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                   ,0x1d91,pcVar4);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&stack0xfffffffffffffbf8,&local_400);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&stack0xfffffffffffffbf8);
                        testing::Message::~Message(&local_400);
                      }
                      gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._5_3_ = 0;
                      gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_1_ = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
                      if (gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_4_ != 0) break;
                      pSVar6 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                (&(this->super_QUICMethodTest).client_);
                      gtest_ar_4.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_4_ = SSL_get_error(pSVar6,-1);
                      if (gtest_ar_4.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_4_ == 0xf) {
                        local_450[1] = 0xffffffff;
                        pSVar6 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                  (&(this->super_QUICMethodTest).client_);
                        local_450[0] = SSL_do_handshake(pSVar6);
                        testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                  ((EqHelper *)local_448,"-1","SSL_do_handshake(client_.get())",
                                   local_450 + 1,local_450);
                        bVar1 = testing::AssertionResult::operator_cast_to_bool
                                          ((AssertionResult *)local_448);
                        if (!bVar1) {
                          testing::Message::Message(&local_458);
                          pcVar4 = testing::AssertionResult::failure_message
                                             ((AssertionResult *)local_448);
                          testing::internal::AssertHelper::AssertHelper
                                    ((AssertHelper *)&gtest_ar_6.message_,kFatalFailure,
                                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                     ,0x1d9a,pcVar4);
                          testing::internal::AssertHelper::operator=
                                    ((AssertHelper *)&gtest_ar_6.message_,&local_458);
                          testing::internal::AssertHelper::~AssertHelper
                                    ((AssertHelper *)&gtest_ar_6.message_);
                          testing::Message::~Message(&local_458);
                        }
                        gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._5_3_ = 0;
                        gtest_ar__1.message_._M_t.
                        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        .
                        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                        ._M_head_impl._4_1_ = !bVar1;
                        testing::AssertionResult::~AssertionResult((AssertionResult *)local_448);
                        if (gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_4_ == 0) {
                          local_478[1] = 0xf;
                          pSVar6 = (SSL *)std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                    (&(this->super_QUICMethodTest).client_);
                          local_478[0] = SSL_get_error(pSVar6,-1);
                          testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                    ((EqHelper *)local_470,"15","SSL_get_error(client_.get(), -1)",
                                     local_478 + 1,local_478);
                          bVar1 = testing::AssertionResult::operator_cast_to_bool
                                            ((AssertionResult *)local_470);
                          if (!bVar1) {
                            testing::Message::Message(&local_480);
                            pcVar4 = testing::AssertionResult::failure_message
                                               ((AssertionResult *)local_470);
                            testing::internal::AssertHelper::AssertHelper
                                      ((AssertHelper *)&gtest_ar__11.message_,kFatalFailure,
                                       "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                       ,0x1d9b,pcVar4);
                            testing::internal::AssertHelper::operator=
                                      ((AssertHelper *)&gtest_ar__11.message_,&local_480);
                            testing::internal::AssertHelper::~AssertHelper
                                      ((AssertHelper *)&gtest_ar__11.message_);
                            testing::Message::~Message(&local_480);
                          }
                          gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._5_3_ = 0;
                          gtest_ar__1.message_._M_t.
                          super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          .
                          super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                          ._M_head_impl._4_1_ = !bVar1;
                          testing::AssertionResult::~AssertionResult((AssertionResult *)local_470);
                          if (gtest_ar__1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_ == 0) {
                            psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                               (&(this->super_QUICMethodTest).client_);
                            SSL_reset_early_data_reject(psVar5);
                            local_499 = QUICMethodTest::CompleteHandshakesForQUIC
                                                  (&this->super_QUICMethodTest);
                            testing::AssertionResult::AssertionResult<bool>
                                      ((AssertionResult *)local_498,&local_499,(type *)0x0);
                            bVar1 = testing::AssertionResult::operator_cast_to_bool
                                              ((AssertionResult *)local_498);
                            if (!bVar1) {
                              testing::Message::Message(&local_4a8);
                              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                        ((string *)&gtest_ar__12.message_,(internal *)local_498,
                                         (AssertionResult *)"CompleteHandshakesForQUIC()","false",
                                         "true",in_R9);
                              pcVar4 = (char *)std::__cxx11::string::c_str();
                              testing::internal::AssertHelper::AssertHelper
                                        (&local_4b0,kFatalFailure,
                                         "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                         ,0x1d9f,pcVar4);
                              testing::internal::AssertHelper::operator=(&local_4b0,&local_4a8);
                              testing::internal::AssertHelper::~AssertHelper(&local_4b0);
                              std::__cxx11::string::~string((string *)&gtest_ar__12.message_);
                              testing::Message::~Message(&local_4a8);
                            }
                            gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._5_3_ = 0;
                            gtest_ar__1.message_._M_t.
                            super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl._4_1_ = !bVar1;
                            testing::AssertionResult::~AssertionResult((AssertionResult *)local_498)
                            ;
                            if (gtest_ar__1.message_._M_t.
                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl._4_4_ == 0) {
                              QUICMethodTest::ExpectHandshakeSuccess(&this->super_QUICMethodTest);
                              psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                 (&(this->super_QUICMethodTest).client_);
                              local_4e4 = SSL_session_reused(psVar5);
                              testing::AssertionResult::AssertionResult<int>
                                        ((AssertionResult *)local_4e0,&local_4e4,(type *)0x0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_4e0);
                              if (!bVar1) {
                                testing::Message::Message(&local_4f0);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__13.message_,(internal *)local_4e0,
                                           (AssertionResult *)"SSL_session_reused(client_.get())",
                                           "false","true",in_R9);
                                pcVar4 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_4f8,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                           ,0x1da3,pcVar4);
                                testing::internal::AssertHelper::operator=(&local_4f8,&local_4f0);
                                testing::internal::AssertHelper::~AssertHelper(&local_4f8);
                                std::__cxx11::string::~string((string *)&gtest_ar__13.message_);
                                testing::Message::~Message(&local_4f0);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_4e0);
                              psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                 (&(this->super_QUICMethodTest).server_);
                              local_52c = SSL_session_reused(psVar5);
                              testing::AssertionResult::AssertionResult<int>
                                        ((AssertionResult *)local_528,&local_52c,(type *)0x0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_528);
                              if (!bVar1) {
                                testing::Message::Message(&local_538);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__14.message_,(internal *)local_528,
                                           (AssertionResult *)"SSL_session_reused(server_.get())",
                                           "false","true",in_R9);
                                pcVar4 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_540,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                           ,0x1da4,pcVar4);
                                testing::internal::AssertHelper::operator=(&local_540,&local_538);
                                testing::internal::AssertHelper::~AssertHelper(&local_540);
                                std::__cxx11::string::~string((string *)&gtest_ar__14.message_);
                                testing::Message::~Message(&local_538);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_528);
                              psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                 (&(this->super_QUICMethodTest).client_);
                              iVar2 = SSL_in_early_data(psVar5);
                              local_571 = iVar2 == 0;
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_570,&local_571,(type *)0x0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_570);
                              if (!bVar1) {
                                testing::Message::Message(&local_580);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__15.message_,(internal *)local_570,
                                           (AssertionResult *)"SSL_in_early_data(client_.get())",
                                           "true","false",in_R9);
                                pcVar4 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_588,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                           ,0x1da5,pcVar4);
                                testing::internal::AssertHelper::operator=(&local_588,&local_580);
                                testing::internal::AssertHelper::~AssertHelper(&local_588);
                                std::__cxx11::string::~string((string *)&gtest_ar__15.message_);
                                testing::Message::~Message(&local_580);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_570);
                              psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                 (&(this->super_QUICMethodTest).server_);
                              iVar2 = SSL_in_early_data(psVar5);
                              local_5b9 = iVar2 == 0;
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_5b8,&local_5b9,(type *)0x0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_5b8);
                              if (!bVar1) {
                                testing::Message::Message(&local_5c8);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__16.message_,(internal *)local_5b8,
                                           (AssertionResult *)"SSL_in_early_data(server_.get())",
                                           "true","false",in_R9);
                                pcVar4 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_5d0,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                           ,0x1da6,pcVar4);
                                testing::internal::AssertHelper::operator=(&local_5d0,&local_5c8);
                                testing::internal::AssertHelper::~AssertHelper(&local_5d0);
                                std::__cxx11::string::~string((string *)&gtest_ar__16.message_);
                                testing::Message::~Message(&local_5c8);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_5b8);
                              psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                 (&(this->super_QUICMethodTest).client_);
                              iVar2 = SSL_early_data_accepted(psVar5);
                              local_601 = iVar2 == 0;
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_600,&local_601,(type *)0x0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_600);
                              if (!bVar1) {
                                testing::Message::Message(&local_610);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          ((string *)&gtest_ar__17.message_,(internal *)local_600,
                                           (AssertionResult *)
                                           "SSL_early_data_accepted(client_.get())","true","false",
                                           in_R9);
                                pcVar4 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_618,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                           ,0x1da7,pcVar4);
                                testing::internal::AssertHelper::operator=(&local_618,&local_610);
                                testing::internal::AssertHelper::~AssertHelper(&local_618);
                                std::__cxx11::string::~string((string *)&gtest_ar__17.message_);
                                testing::Message::~Message(&local_610);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_600);
                              psVar5 = std::unique_ptr<ssl_st,_bssl::internal::Deleter>::get
                                                 (&(this->super_QUICMethodTest).server_);
                              iVar2 = SSL_early_data_accepted(psVar5);
                              local_649 = iVar2 == 0;
                              testing::AssertionResult::AssertionResult<bool>
                                        ((AssertionResult *)local_648,&local_649,(type *)0x0);
                              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                                ((AssertionResult *)local_648);
                              if (!bVar1) {
                                testing::Message::Message(&local_658);
                                testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                                          (&local_680,(internal *)local_648,
                                           (AssertionResult *)
                                           "SSL_early_data_accepted(server_.get())","true","false",
                                           in_R9);
                                pcVar4 = (char *)std::__cxx11::string::c_str();
                                testing::internal::AssertHelper::AssertHelper
                                          (&local_660,kNonFatalFailure,
                                           "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                           ,0x1da8,pcVar4);
                                testing::internal::AssertHelper::operator=(&local_660,&local_658);
                                testing::internal::AssertHelper::~AssertHelper(&local_660);
                                std::__cxx11::string::~string((string *)&local_680);
                                testing::Message::~Message(&local_658);
                              }
                              testing::AssertionResult::~AssertionResult
                                        ((AssertionResult *)local_648);
                              gtest_ar__1.message_._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                              ._M_head_impl._4_4_ = 0;
                            }
                          }
                        }
                        break;
                      }
                      local_424 = 2;
                      testing::internal::EqHelper::Compare<int,_int,_nullptr>
                                ((EqHelper *)local_420,"2","err",&local_424,
                                 (int *)((long)&gtest_ar_4.message_._M_t.
                                                super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                ._M_t.
                                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                .
                                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                        + 4));
                      bVar1 = testing::AssertionResult::operator_cast_to_bool
                                        ((AssertionResult *)local_420);
                      if (!bVar1) {
                        testing::Message::Message(&local_430);
                        pcVar4 = testing::AssertionResult::failure_message
                                           ((AssertionResult *)local_420);
                        testing::internal::AssertHelper::AssertHelper
                                  ((AssertHelper *)&gtest_ar_5.message_,kFatalFailure,
                                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/ssl/ssl_test.cc"
                                   ,0x1d96,pcVar4);
                        testing::internal::AssertHelper::operator=
                                  ((AssertHelper *)&gtest_ar_5.message_,&local_430);
                        testing::internal::AssertHelper::~AssertHelper
                                  ((AssertHelper *)&gtest_ar_5.message_);
                        testing::Message::~Message(&local_430);
                      }
                      gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._5_3_ = 0;
                      gtest_ar__1.message_._M_t.
                      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      .
                      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                      ._M_head_impl._4_1_ = !bVar1;
                      testing::AssertionResult::~AssertionResult((AssertionResult *)local_420);
                    } while (gtest_ar__1.message_._M_t.
                             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             .
                             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl._4_4_ == 0);
                  }
                }
              }
            }
          }
        }
      }
      std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&gtest_ar__2.message_);
    }
  }
  return;
}

Assistant:

TEST_F(QUICMethodTest, ZeroRTTRejectMismatchedParameters) {
  const SSL_QUIC_METHOD quic_method = DefaultQUICMethod();

  SSL_CTX_set_session_cache_mode(client_ctx_.get(), SSL_SESS_CACHE_BOTH);
  SSL_CTX_set_early_data_enabled(client_ctx_.get(), 1);
  SSL_CTX_set_early_data_enabled(server_ctx_.get(), 1);
  ASSERT_TRUE(SSL_CTX_set_quic_method(client_ctx_.get(), &quic_method));
  ASSERT_TRUE(SSL_CTX_set_quic_method(server_ctx_.get(), &quic_method));


  bssl::UniquePtr<SSL_SESSION> session = CreateClientSessionForQUIC();
  ASSERT_TRUE(session);

  ASSERT_TRUE(CreateClientAndServer());
  static const uint8_t new_context[] = {4};
  ASSERT_TRUE(SSL_set_quic_early_data_context(server_.get(), new_context,
                                              sizeof(new_context)));
  SSL_set_session(client_.get(), session.get());

  // The client handshake should return immediately into the early data
  // state.
  ASSERT_EQ(SSL_do_handshake(client_.get()), 1);
  EXPECT_TRUE(SSL_in_early_data(client_.get()));
  // The transport should have keys for sending 0-RTT data.
  EXPECT_TRUE(transport_->client()->HasWriteSecret(ssl_encryption_early_data));

  // The server will consume the ClientHello, but it will not accept 0-RTT.
  ASSERT_TRUE(ProvideHandshakeData(server_.get()));
  ASSERT_EQ(SSL_do_handshake(server_.get()), -1);
  ASSERT_EQ(SSL_ERROR_WANT_READ, SSL_get_error(server_.get(), -1));
  EXPECT_FALSE(SSL_in_early_data(server_.get()));
  EXPECT_FALSE(transport_->server()->HasReadSecret(ssl_encryption_early_data));

  // The client consumes the server response and signals 0-RTT rejection.
  for (;;) {
    ASSERT_TRUE(ProvideHandshakeData(client_.get()));
    ASSERT_EQ(-1, SSL_do_handshake(client_.get()));
    int err = SSL_get_error(client_.get(), -1);
    if (err == SSL_ERROR_EARLY_DATA_REJECTED) {
      break;
    }
    ASSERT_EQ(SSL_ERROR_WANT_READ, err);
  }

  // As in TLS over TCP, 0-RTT rejection is sticky.
  ASSERT_EQ(-1, SSL_do_handshake(client_.get()));
  ASSERT_EQ(SSL_ERROR_EARLY_DATA_REJECTED, SSL_get_error(client_.get(), -1));

  // Finish up the client and server handshakes.
  SSL_reset_early_data_reject(client_.get());
  ASSERT_TRUE(CompleteHandshakesForQUIC());

  // Both sides can now exchange 1-RTT data.
  ExpectHandshakeSuccess();
  EXPECT_TRUE(SSL_session_reused(client_.get()));
  EXPECT_TRUE(SSL_session_reused(server_.get()));
  EXPECT_FALSE(SSL_in_early_data(client_.get()));
  EXPECT_FALSE(SSL_in_early_data(server_.get()));
  EXPECT_FALSE(SSL_early_data_accepted(client_.get()));
  EXPECT_FALSE(SSL_early_data_accepted(server_.get()));
}